

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rasterization_stream_state
          (Impl *this,Value *state,VkPipelineRasterizationStateStreamCreateInfoEXT **out_info)

{
  uint uVar1;
  VkPipelineRasterizationStateStreamCreateInfoEXT *pVVar2;
  Type pGVar3;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPipelineRasterizationStateStreamCreateInfoEXT>
                     (&this->allocator);
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"flags");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->flags = uVar1;
  pGVar3 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"rasterizationStream");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar3);
  pVVar2->rasterizationStream = uVar1;
  *out_info = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_rasterization_stream_state(const Value &state, VkPipelineRasterizationStateStreamCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineRasterizationStateStreamCreateInfoEXT>();

	info->flags = state["flags"].GetUint();
	info->rasterizationStream = state["rasterizationStream"].GetUint();

	*out_info = info;
	return true;
}